

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

int Gia_ManEncodeFanin(Gia_Man_t *p,int iLit)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iLit_local;
  Gia_Man_t *p_local;
  
  iVar1 = Abc_Lit2Var(iLit);
  pObj_00 = Gia_ManObj(p,iVar1);
  iVar1 = Gia_ObjIsConst0(pObj_00);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsPi(p,pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsXor(pObj_00);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsMux(p,pObj_00);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsAnd(pObj_00);
            if (iVar1 == 0) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                            ,0x2af,"int Gia_ManEncodeFanin(Gia_Man_t *, int)");
            }
            p_local._4_4_ = 0xd;
          }
          else {
            p_local._4_4_ = 0xc;
          }
        }
        else {
          p_local._4_4_ = 0xb;
        }
      }
      else {
        p_local._4_4_ = 10;
      }
    }
    else {
      p_local._4_4_ = 9;
    }
  }
  else {
    p_local._4_4_ = 7;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManEncodeFanin( Gia_Man_t * p, int iLit )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
    if ( Gia_ObjIsConst0(pObj) )
        return iC0;
    if ( Gia_ObjIsPi(p, pObj) )
        return iPI;
    if ( Gia_ObjIsCi(pObj) )
        return iFF;
    if ( Gia_ObjIsXor(pObj) )
        return iXOR;
    if ( Gia_ObjIsMux(p, pObj) )
        return iMUX;
    assert( Gia_ObjIsAnd(pObj) );
    return iAND;
//    if ( Abc_LitIsCompl(iLit) )
//        return iANDn;
//    else
//        return iANDp;
}